

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

bool __thiscall
OpenMD::FragmentStamp::addRigidBodyStamp(FragmentStamp *this,RigidBodyStamp *rigidbody)

{
  int iVar1;
  ostream *poVar2;
  OpenMDException *this_00;
  undefined8 uVar3;
  RigidBodyStamp *in_RSI;
  ostringstream oss;
  bool ret;
  FragmentStamp *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde8;
  RigidBodyStamp *in_stack_fffffffffffffe20;
  vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
  *in_stack_fffffffffffffe28;
  FragmentStamp *in_stack_fffffffffffffe30;
  string local_1c0 [48];
  ostringstream local_190 [383];
  undefined1 local_11;
  RigidBodyStamp *local_10;
  
  local_10 = in_RSI;
  local_11 = addIndexSensitiveStamp<std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>,OpenMD::RigidBodyStamp>
                       (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe20);
  if (!(bool)local_11) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"Error in Fragment ");
    getName_abi_cxx11_(in_stack_fffffffffffffdd8);
    poVar2 = std::operator<<(poVar2,local_1c0);
    this_00 = (OpenMDException *)
              std::operator<<(poVar2,": multiple rigidbodies have the same indices: ");
    iVar1 = RigidBodyStamp::getIndex(local_10);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,iVar1);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_1c0);
    uVar3 = __cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    OpenMDException::OpenMDException(this_00,(string *)CONCAT44(iVar1,in_stack_fffffffffffffde8));
    __cxa_throw(uVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  return (bool)local_11;
}

Assistant:

bool FragmentStamp::addRigidBodyStamp(RigidBodyStamp* rigidbody) {
    bool ret = addIndexSensitiveStamp(rigidBodyStamps_, rigidbody);
    if (!ret) {
      std::ostringstream oss;
      oss << "Error in Fragment " << getName()
          << ": multiple rigidbodies have the same indices: "
          << rigidbody->getIndex() << "\n";
      throw OpenMDException(oss.str());
    }
    return ret;
  }